

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O1

string * __thiscall
QPDFPageObjectHelper::placeFormXObject
          (string *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          string *name,Rectangle rect,QPDFMatrix *cm,bool invert_transformations,bool allow_shrink,
          bool allow_expand)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  double *pdVar4;
  size_type *psVar5;
  QPDFObjectHandle local_e8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  QPDFMatrix local_78;
  string local_48;
  
  local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fo->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (fo->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  getMatrixForFormXObjectPlacement
            (&local_78,this,&local_e8,rect,invert_transformations,allow_shrink,allow_expand);
  cm->e = local_78.e;
  cm->f = local_78.f;
  cm->c = local_78.c;
  cm->d = local_78.d;
  cm->a = local_78.a;
  cm->b = local_78.b;
  if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFMatrix::unparse_abi_cxx11_(&local_48,cm);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x2645a6);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c8 = *plVar3;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *plVar3;
    local_d8 = (long *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a8 = *plVar3;
    lStack_a0 = plVar2[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*plVar2;
  }
  local_b0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)(name->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
  pdVar4 = (double *)(plVar2 + 2);
  if ((double *)*plVar2 == pdVar4) {
    local_78.c = *pdVar4;
    local_78.d = (double)plVar2[3];
    local_78.a = (double)&local_78.c;
  }
  else {
    local_78.c = *pdVar4;
    local_78.a = (double)*plVar2;
  }
  local_78.b = (double)plVar2[1];
  *plVar2 = (long)pdVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((double *)local_78.a != &local_78.c) {
    operator_delete((void *)local_78.a,(long)local_78.c + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFPageObjectHelper::placeFormXObject(
    QPDFObjectHandle fo,
    std::string const& name,
    QPDFObjectHandle::Rectangle rect,
    QPDFMatrix& cm,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    cm = getMatrixForFormXObjectPlacement(
        fo, rect, invert_transformations, allow_shrink, allow_expand);
    return ("q\n" + cm.unparse() + " cm\n" + name + " Do\n" + "Q\n");
}